

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O1

void check_type_68k(int type,LispPTR *ptr)

{
  DLword *pDVar1;
  DLword *pDVar2;
  LispPTR LVar3;
  
  pDVar1 = MDStypetbl;
  if (((ulong)ptr & 1) != 0) {
    printf("Misaligned pointer in LAddrFromNative %p\n",ptr);
  }
  if ((*(ushort *)
        ((ulong)(pDVar1 + ((uint)((ulong)((long)ptr - (long)Lisp_world) >> 10) & 0x7fffff)) ^ 2) &
      0x7ff) == type) {
    if (((ulong)ptr & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",ptr);
    }
    pDVar2 = MDStypetbl;
    pDVar1 = Lisp_world;
    if (((ulong)ptr & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",ptr);
    }
    printf("LispPTR 0x%x is the datatype %d\n",(ulong)((long)ptr - (long)pDVar1) >> 1,
           (ulong)(*(ushort *)
                    ((ulong)(pDVar2 + ((uint)((ulong)((long)ptr - (long)Lisp_world) >> 10) &
                                      0x7fffff)) ^ 2) & 0x7ff));
    return;
  }
  LVar3 = LAddrFromNative(ptr);
  printf("Mismatching occur !!! LispAddr 0x%x  type %d\n",(ulong)LVar3,type);
  exit(-1);
}

Assistant:

void check_type_68k(int type, LispPTR *ptr) {
  if (type != (GetTypeNumber(LAddrFromNative(ptr)))) {
    printf("Mismatching occur !!! LispAddr 0x%x  type %d\n", LAddrFromNative(ptr), type);
    exit(-1);
  }

  printf("LispPTR 0x%x is the datatype %d\n", LAddrFromNative(ptr),
         GetTypeNumber(LAddrFromNative(ptr)));
}